

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

int Bus_SclCompareFanouts(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  int iVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = Bus_SclObjETime(*pp1);
  fVar3 = Bus_SclObjETime(*pp2);
  iVar1 = -1;
  if (fVar3 <= fVar2) {
    fVar2 = Bus_SclObjETime(*pp1);
    fVar3 = Bus_SclObjETime(*pp2);
    if (fVar2 <= fVar3) {
      fVar2 = Bus_SclObjCin(*pp1);
      fVar3 = Bus_SclObjCin(*pp2);
      if (fVar2 <= fVar3) {
        fVar2 = Bus_SclObjCin(*pp1);
        fVar3 = Bus_SclObjCin(*pp2);
        iVar1 = (uint)(fVar2 < fVar3) * 2 + -1;
      }
    }
    else {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int Bus_SclCompareFanouts( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    float Espilon = 0;//10; // 10 ps
    if ( Bus_SclObjETime(*pp1) < Bus_SclObjETime(*pp2) - Espilon )
        return -1;
    if ( Bus_SclObjETime(*pp1) > Bus_SclObjETime(*pp2) + Espilon )
        return 1;
    if ( Bus_SclObjCin(*pp1) > Bus_SclObjCin(*pp2) )
        return -1;
    if ( Bus_SclObjCin(*pp1) < Bus_SclObjCin(*pp2) )
        return 1;
    return -1;
}